

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O1

void _DOCTEST_ANON_TMP_53<std::shared_ptr<int>>(void)

{
  Result *in_R9;
  shared_ptr<int> out;
  shared_ptr<int> in;
  ExpressionDecomposer local_9c;
  int *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  shared_ptr<int> local_88;
  int *local_78;
  Enum local_70;
  Result local_68;
  Result local_48;
  Result local_28;
  
  local_88.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_88.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (anonymous_namespace)::roundtrip<std::shared_ptr<int>>
            ((_anonymous_namespace_ *)&local_98,&local_88);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_9c,DT_CHECK);
  local_78 = (int *)((ulong)(local_98 == (int *)0x0) | (ulong)local_9c.m_at << 0x20);
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_28,(Expression_lhs *)&local_78);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1b828c,(char *)0x194,0x1b8663,&local_28.m_passed,in_R9);
  doctest::String::~String(&local_28.m_decomp);
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_88.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_88.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(4);
  *local_88.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0x7b;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_88.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             local_88.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (anonymous_namespace)::roundtrip<std::shared_ptr<int>>
            ((_anonymous_namespace_ *)&local_98,&local_88);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_9c,DT_REQUIRE);
  local_78 = (int *)((ulong)(local_98 != (int *)0x0) | (ulong)local_9c.m_at << 0x20);
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_48,(Expression_lhs *)&local_78);
  doctest::detail::decomp_assert
            ((detail *)0xc,0x1b828c,(char *)0x19b,0x1b8662,&local_48.m_passed,in_R9);
  doctest::String::~String(&local_48.m_decomp);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_9c,DT_CHECK);
  local_78 = local_88.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70 = local_9c.m_at;
  doctest::detail::Expression_lhs<int&>::operator==
            (&local_68,(Expression_lhs<int&> *)&local_78,local_98);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1b828c,(char *)0x19c,0x1b8668,&local_68.m_passed,in_R9);
  doctest::String::~String(&local_68.m_decomp);
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_88.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

int age(const int i) { return _age = i; }